

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

tExecuteBlit irr::getBlitter2(eBlitter operation,IImage *dest,IImage *source)

{
  IImage *in_RDX;
  IImage *in_RSI;
  int in_EDI;
  blitterTable *b;
  ECOLOR_FORMAT destFormat;
  ECOLOR_FORMAT sourceFormat;
  ECOLOR_FORMAT local_38;
  ECOLOR_FORMAT local_34;
  int *local_30;
  
  if (in_RDX == (IImage *)0x0) {
    local_34 = ~ECF_A1R5G5B5;
  }
  else {
    local_34 = video::IImage::getColorFormat(in_RDX);
  }
  if (in_RSI == (IImage *)0x0) {
    local_38 = ~ECF_A1R5G5B5;
  }
  else {
    local_38 = video::IImage::getColorFormat(in_RSI);
  }
  local_30 = &blitTable;
  do {
    if (*local_30 == 0) {
      return (tExecuteBlit)0x0;
    }
    if (*local_30 == in_EDI) {
      if (((local_30[1] == -1) || (local_30[1] == local_38)) &&
         ((local_30[2] == -1 || (local_30[2] == local_34)))) {
        return *(tExecuteBlit *)(local_30 + 4);
      }
      if ((local_30[1] == -2) && (local_34 == local_38)) {
        return *(tExecuteBlit *)(local_30 + 4);
      }
    }
    local_30 = local_30 + 6;
  } while( true );
}

Assistant:

static inline tExecuteBlit getBlitter2(eBlitter operation, const video::IImage *dest, const video::IImage *source)
{
	video::ECOLOR_FORMAT sourceFormat = (video::ECOLOR_FORMAT)(source ? source->getColorFormat() : -1);
	video::ECOLOR_FORMAT destFormat = (video::ECOLOR_FORMAT)(dest ? dest->getColorFormat() : -1);

	const blitterTable *b = blitTable;

	while (b->operation != BLITTER_INVALID) {
		if (b->operation == operation) {
			if ((b->destFormat == -1 || b->destFormat == destFormat) &&
					(b->sourceFormat == -1 || b->sourceFormat == sourceFormat))
				return b->func;
			else if (b->destFormat == -2 && (sourceFormat == destFormat))
				return b->func;
		}
		b += 1;
	}
	return 0;
}